

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadrilateral.cpp
# Opt level: O0

void pztopology::TPZQuadrilateral::ComputeDirections
               (int side,TPZFMatrix<double> *gradx,TPZFMatrix<double> *directions,
               TPZVec<int> *sidevectors)

{
  int64_t iVar1;
  int *piVar2;
  TPZVec<int> *in_RCX;
  long *in_RDX;
  TPZBaseMatrix *in_RSI;
  undefined4 in_EDI;
  int ip_4;
  int fnumvec_4;
  int inumvec_4;
  int ip_3;
  int fnumvec_3;
  int inumvec_3;
  int ip_2;
  int fnumvec_2;
  int inumvec_2;
  int ip_1;
  int fnumvec_1;
  int inumvec_1;
  int ip;
  int fnumvec;
  int inumvec;
  int col;
  int lin;
  TPZFMatrix<double> t1vec;
  TPZFMatrix<double> bvec;
  size_t in_stack_00000228;
  char *in_stack_00000230;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  int iVar3;
  int64_t in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  TPZFMatrix<double> *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  int64_t in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  TPZFMatrix<double> *in_stack_fffffffffffffe50;
  int local_190;
  int local_184;
  int local_178;
  int local_16c;
  int local_160;
  int local_154;
  int local_150;
  
  iVar1 = TPZBaseMatrix::Cols(in_RSI);
  if (iVar1 != 2) {
    pzinternal::DebugStopImpl(in_stack_00000230,in_stack_00000228);
  }
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffe50,CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)
             ,in_stack_fffffffffffffe40);
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffe50,CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)
             ,in_stack_fffffffffffffe40);
  TPZFMatrix<double>::Redim
            ((TPZFMatrix<double> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
             (int64_t)in_stack_fffffffffffffe30,
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  TPZFMatrix<double>::Redim
            ((TPZFMatrix<double> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
             (int64_t)in_stack_fffffffffffffe30,
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  (**(code **)(*in_RDX + 0x70))(in_RDX,3,0x12);
  for (local_150 = 0; local_150 < 0x12; local_150 = local_150 + 1) {
    for (local_154 = 0; local_154 < 2; local_154 = local_154 + 1) {
      TPZFMatrix<double>::PutVal
                (in_stack_fffffffffffffe30,
                 CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                 in_stack_fffffffffffffe20,
                 (double *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      TPZFMatrix<double>::PutVal
                (in_stack_fffffffffffffe30,
                 CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                 in_stack_fffffffffffffe20,
                 (double *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    }
  }
  switch(in_EDI) {
  case 0:
    break;
  case 1:
    break;
  case 2:
    break;
  case 3:
    break;
  case 4:
    (**(code **)(*in_RDX + 0x70))(in_RDX,3);
    (*in_RCX->_vptr_TPZVec[3])(in_RCX,3);
    computedirectionsq(bvec.fWork.fNAlloc._4_4_,(int)bvec.fWork.fNAlloc,
                       (TPZFMatrix<double> *)bvec.fWork.fNElements,
                       (TPZFMatrix<double> *)bvec.fWork.fStore,
                       (TPZFMatrix<double> *)bvec.fWork._vptr_TPZVec,
                       (TPZFMatrix<double> *)bvec.fPivot._48_8_);
    for (local_160 = 0; local_160 < 3; local_160 = local_160 + 1) {
      iVar3 = *(int *)(vectorsideorder + (long)local_160 * 4);
      piVar2 = TPZVec<int>::operator[](in_RCX,(long)local_160);
      *piVar2 = iVar3;
    }
    break;
  case 5:
    (**(code **)(*in_RDX + 0x70))(in_RDX,3);
    (*in_RCX->_vptr_TPZVec[3])(in_RCX,3);
    computedirectionsq(bvec.fWork.fNAlloc._4_4_,(int)bvec.fWork.fNAlloc,
                       (TPZFMatrix<double> *)bvec.fWork.fNElements,
                       (TPZFMatrix<double> *)bvec.fWork.fStore,
                       (TPZFMatrix<double> *)bvec.fWork._vptr_TPZVec,
                       (TPZFMatrix<double> *)bvec.fPivot._48_8_);
    for (local_16c = 0; local_16c < 3; local_16c = local_16c + 1) {
      iVar3 = *(int *)(vectorsideorder + (long)(local_16c + 3) * 4);
      piVar2 = TPZVec<int>::operator[](in_RCX,(long)local_16c);
      *piVar2 = iVar3;
    }
    break;
  case 6:
    (**(code **)(*in_RDX + 0x70))(in_RDX,3);
    (*in_RCX->_vptr_TPZVec[3])(in_RCX,3);
    computedirectionsq(bvec.fWork.fNAlloc._4_4_,(int)bvec.fWork.fNAlloc,
                       (TPZFMatrix<double> *)bvec.fWork.fNElements,
                       (TPZFMatrix<double> *)bvec.fWork.fStore,
                       (TPZFMatrix<double> *)bvec.fWork._vptr_TPZVec,
                       (TPZFMatrix<double> *)bvec.fPivot._48_8_);
    for (local_178 = 0; local_178 < 3; local_178 = local_178 + 1) {
      iVar3 = *(int *)(vectorsideorder + (long)(local_178 + 6) * 4);
      piVar2 = TPZVec<int>::operator[](in_RCX,(long)local_178);
      *piVar2 = iVar3;
    }
    break;
  case 7:
    (**(code **)(*in_RDX + 0x70))(in_RDX,3);
    (*in_RCX->_vptr_TPZVec[3])(in_RCX,3);
    computedirectionsq(bvec.fWork.fNAlloc._4_4_,(int)bvec.fWork.fNAlloc,
                       (TPZFMatrix<double> *)bvec.fWork.fNElements,
                       (TPZFMatrix<double> *)bvec.fWork.fStore,
                       (TPZFMatrix<double> *)bvec.fWork._vptr_TPZVec,
                       (TPZFMatrix<double> *)bvec.fPivot._48_8_);
    for (local_184 = 0; local_184 < 3; local_184 = local_184 + 1) {
      iVar3 = *(int *)(vectorsideorder + (long)(local_184 + 9) * 4);
      piVar2 = TPZVec<int>::operator[](in_RCX,(long)local_184);
      *piVar2 = iVar3;
    }
    break;
  case 8:
    (**(code **)(*in_RDX + 0x70))(in_RDX,3,6);
    (*in_RCX->_vptr_TPZVec[3])(in_RCX,6);
    computedirectionsq(bvec.fWork.fNAlloc._4_4_,(int)bvec.fWork.fNAlloc,
                       (TPZFMatrix<double> *)bvec.fWork.fNElements,
                       (TPZFMatrix<double> *)bvec.fWork.fStore,
                       (TPZFMatrix<double> *)bvec.fWork._vptr_TPZVec,
                       (TPZFMatrix<double> *)bvec.fPivot._48_8_);
    for (local_190 = 0; local_190 < 6; local_190 = local_190 + 1) {
      iVar3 = *(int *)(vectorsideorder + (long)(local_190 + 0xc) * 4);
      piVar2 = TPZVec<int>::operator[](in_RCX,(long)local_190);
      *piVar2 = iVar3;
    }
    break;
  default:
    pzinternal::DebugStopImpl(in_stack_00000230,in_stack_00000228);
  }
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x15946a8);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x15946b5);
  return;
}

Assistant:

void TPZQuadrilateral::ComputeDirections(int side, TPZFMatrix<REAL> &gradx, TPZFMatrix<REAL> &directions, TPZVec<int> &sidevectors)
    {
        if(gradx.Cols()!=2)
        {
            DebugStop();
        }
        TPZFMatrix<REAL> bvec(2,18);
        TPZFMatrix<REAL> t1vec(2,18);
       
        bvec.Redim(2, 18);
        t1vec.Redim(2, 18);
        directions.Redim(3, 18);
        for (int lin = 0; lin<18; lin++)
        {
            for(int col = 0;col<2;col++)
            {
                bvec.PutVal(col, lin, bQuad[lin][col]);
                t1vec.PutVal(col, lin, tQuad[lin][col]);
            }
        }
        // calcula os vetores
        
        switch (side) {
            case 0:
            {
            }
                break;
            case 1:
            {
            }
                break;
            case 2:
            {
            }
                break;
            case 3:
            {
            }
                break;
            case 4:
            {
                directions.Redim(3, 3);
                sidevectors.Resize(3);
                int inumvec = 0, fnumvec = 2;
                computedirectionsq(inumvec, fnumvec, bvec, t1vec, gradx, directions);
                for (int ip = 0; ip < 3; ip++) {
                    sidevectors[ip] = vectorsideorder[ip];
                }
                
            }
                break;
            case 5:
            {
                directions.Redim(3, 3);
                sidevectors.Resize(3);
                int inumvec = 3, fnumvec = 5;
                computedirectionsq(inumvec, fnumvec, bvec, t1vec, gradx, directions);
                for (int ip = 0; ip < 3; ip++) {
                    sidevectors[ip] = vectorsideorder[ip+inumvec];
                }
            }
                break;
            case 6:
            {
                directions.Redim(3, 3);
                sidevectors.Resize(3);
                int inumvec = 6, fnumvec = 8;
                computedirectionsq(inumvec, fnumvec, bvec, t1vec, gradx, directions);
                for (int ip = 0; ip < 3; ip++) {
                    sidevectors[ip] = vectorsideorder[ip+inumvec];
                }
            }
                break;
            case 7:
            {
                directions.Redim(3, 3);
                sidevectors.Resize(3);
                int inumvec = 9, fnumvec = 11;
                computedirectionsq(inumvec, fnumvec, bvec, t1vec, gradx, directions);
                for (int ip = 0; ip < 3; ip++) {
                    sidevectors[ip] = vectorsideorder[ip+inumvec];
                }
            }
                break;
            case 8:
            {
                directions.Redim(3, 6);
                sidevectors.Resize(6);
                int inumvec = 12, fnumvec = 17;
                computedirectionsq(inumvec, fnumvec, bvec, t1vec, gradx, directions);
                for (int ip = 0; ip < 6; ip++) {
                    sidevectors[ip] = vectorsideorder[ip+inumvec];
                }
            }
                break;
                
            default:
                DebugStop();
                break;
        }

        
	}